

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

_view_class gl4cts::TextureViewUtilities::getViewClassForInternalformat(GLenum internalformat)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if ((&internalformat_view_compatibility_array)[lVar1 * 2] == internalformat) {
      return (&DAT_01aa3d14)[lVar1 * 2];
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x3e);
  return VIEW_CLASS_COUNT;
}

Assistant:

_view_class TextureViewUtilities::getViewClassForInternalformat(const glw::GLenum internalformat)
{
	_view_class result = VIEW_CLASS_UNDEFINED;

	/* Note that n_internalformat_view_compatibility_array_entries needs to be divided by 2
	 * because the value refers to a total number of entries in the array, not to the number
	 * of pairs that can be read.
	 */
	for (int n_entry = 0; n_entry < (n_internalformat_view_compatibility_array_entries >> 1); n_entry++)
	{
		glw::GLenum array_internalformat = internalformat_view_compatibility_array[(n_entry * 2) + 0];
		_view_class view_class			 = (_view_class)internalformat_view_compatibility_array[(n_entry * 2) + 1];

		if (array_internalformat == internalformat)
		{
			result = view_class;

			break;
		}
	} /* for (all pairs in data array) */

	return result;
}